

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int cram_huffman_decode_char(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  int iVar1;
  int iVar2;
  cram_huffman_code *pcVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  
  iVar1 = (c->field_6).huffman.ncodes;
  pcVar3 = (c->field_6).huffman.codes;
  uVar4 = *out_size;
  if (*out_size < 1) {
    uVar4 = 0;
  }
  uVar5 = 0;
  do {
    if (uVar5 == uVar4) {
      return 0;
    }
    uVar10 = 0;
    iVar8 = 0;
    iVar6 = 0;
    do {
      iVar2 = pcVar3[uVar10].len;
      if (iVar2 - iVar6 == 0 || iVar2 < iVar6) {
        return -1;
      }
      sVar11 = in->byte;
      uVar9 = (ulong)in->bit;
      if ((in->alloc - sVar11) * 8 + 7 + uVar9 < (ulong)(uint)(iVar2 - iVar6)) {
        return -1;
      }
      for (; iVar2 != iVar6; iVar6 = iVar6 + 1) {
        uVar7 = (uint)uVar9;
        iVar8 = (uint)((in->data[sVar11] >> (uVar7 & 0x1f) & 1) != 0) + iVar8 * 2;
        sVar11 = sVar11 + ((int)uVar7 < 1);
        in->byte = sVar11;
        uVar7 = uVar7 - 1 & 7;
        in->bit = uVar7;
        uVar9 = (ulong)uVar7;
      }
      uVar7 = iVar8 - pcVar3[uVar10].p;
      uVar10 = (ulong)uVar7;
      if (iVar1 <= (int)uVar7) {
        return -1;
      }
      if ((int)uVar7 < 0) {
        return -1;
      }
      iVar6 = iVar2;
    } while ((pcVar3[uVar7].code != iVar8) || (pcVar3[uVar7].len != iVar2));
    out[uVar5] = (char)pcVar3[uVar7].symbol;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int cram_huffman_decode_char(cram_slice *slice, cram_codec *c,
			     cram_block *in, char *out, int *out_size) {
    int i, n, ncodes = c->huffman.ncodes;
    const cram_huffman_code * const codes = c->huffman.codes;

    for (i = 0, n = *out_size; i < n; i++) {
	int idx = 0;
	int val = 0, len = 0, last_len = 0;

	for (;;) {
	    int dlen = codes[idx].len - last_len;
	    if (dlen <= 0 || (in->alloc - in->byte)*8 + in->bit + 7 < dlen)
		return -1;

	    //val <<= dlen;
	    //val  |= get_bits_MSB(in, dlen);
	    //last_len = (len += dlen);

	    last_len = (len += dlen);
	    for (; dlen; dlen--) GET_BIT_MSB(in, val);

	    idx = val - codes[idx].p;
	    if (idx >= ncodes || idx < 0)
		return -1;

	    if (codes[idx].code == val && codes[idx].len == len) {
		out[i] = codes[idx].symbol;
		break;
	    }
	}
    }

    return 0;
}